

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.h
# Opt level: O0

Segment * __thiscall
mnf::Manifold::getView<0>(Segment *__return_storage_ptr__,Manifold *this,RefVec *val,size_t i)

{
  ulong uVar1;
  Index IVar2;
  Index IVar3;
  Index n;
  size_t i_local;
  RefVec *val_local;
  Manifold *this_local;
  
  uVar1 = (**(code **)(*(long *)this + 0x38))();
  mnf_assert(i < uVar1);
  IVar2 = Eigen::
          EigenBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ::size((EigenBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  *)val);
  IVar3 = getDim<0>(this);
  mnf_assert(IVar2 == IVar3);
  IVar3 = getStart<0>(this,i);
  n = getDim<0>(this,i);
  Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>::
  segment<long>(__return_storage_ptr__,
                (DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 *)val,IVar3,n);
  return __return_storage_ptr__;
}

Assistant:

inline Segment Manifold::getView(RefVec val, size_t i) const
{
  mnf_assert(i < numberOfSubManifolds() && "invalid index");
  mnf_assert(val.size() == getDim<D>());
  return val.segment(getStart<D>(i), getDim<D>(i));
}